

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O0

int matchPat(atom *a,pattern *pat)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  int local_ac;
  bool local_a1;
  int local_a0;
  bool local_9a;
  bool local_99;
  int local_98;
  int local_94;
  char local_88 [8];
  char msg [100];
  int rc;
  int lp;
  pattern *pat_local;
  atom *a_local;
  
  msg[0x60] = '\0';
  msg[0x61] = '\0';
  msg[0x62] = '\0';
  msg[99] = '\0';
  if (pat != (pattern *)0x0) {
    switch(pat->type) {
    case 300:
      iVar1 = matchPat(a,pat->lhs);
      if (iVar1 == 0) {
        local_94 = matchPat(a,pat->rhs);
      }
      else {
        local_94 = 1;
      }
      msg[0x60] = (undefined1)local_94;
      msg[0x61] = local_94._1_1_;
      msg[0x62] = local_94._2_1_;
      msg[99] = local_94._3_1_;
      break;
    case 0x12d:
      iVar1 = matchPat(a,pat->lhs);
      if (iVar1 == 0) {
        local_98 = 0;
      }
      else {
        local_98 = matchPat(a,pat->rhs);
      }
      msg[0x60] = (undefined1)local_98;
      msg[0x61] = local_98._1_1_;
      msg[0x62] = local_98._2_1_;
      msg[99] = local_98._3_1_;
      break;
    case 0x12e:
      iVar1 = matchPat(a,pat->lhs);
      msg._96_4_ = ZEXT14((iVar1 != 0 ^ 0xffU) & 1);
      break;
    case 0x12f:
      local_9a = false;
      if (pat->lhs->val <= a->r->resid) {
        local_9a = a->r->resid <= pat->rhs->val;
      }
      msg._96_4_ = ZEXT14(local_9a);
      break;
    case 0x130:
      msg._96_4_ = ZEXT14(a->r->file == pat->val);
      break;
    case 0x131:
      msg._96_4_ = ZEXT14(a->r->model == pat->val);
      break;
    case 0x132:
      pcVar2 = lexString(pat->val);
      sVar3 = strlen(pcVar2);
      pcVar2 = lexString(pat->val);
      iVar1 = strncmp(pcVar2,a->r->chain,(long)(int)sVar3);
      msg._96_4_ = ZEXT14(iVar1 == 0);
      break;
    case 0x133:
      local_99 = true;
      if (a->altConf != ' ') {
        local_99 = (int)a->altConf == pat->val;
      }
      msg._96_4_ = ZEXT14(local_99);
      break;
    case 0x134:
      msg._96_4_ = ZEXT14(a->r->resid == pat->val);
      break;
    case 0x135:
      pcVar2 = lexString(pat->val);
      sVar3 = strlen(pcVar2);
      pcVar2 = lexString(pat->val);
      iVar1 = strncmp(pcVar2,a->r->resname,(long)(int)sVar3);
      msg._96_4_ = ZEXT14(iVar1 == 0);
      break;
    case 0x136:
      msg[0x60] = '\x01';
      msg[0x61] = '\0';
      msg[0x62] = '\0';
      msg[99] = '\0';
      break;
    case 0x137:
      msg[0x60] = '\0';
      msg[0x61] = '\0';
      msg[0x62] = '\0';
      msg[99] = '\0';
      break;
    case 0x138:
      msg._96_4_ = a->props & pat->val;
      break;
    case 0x139:
      pcVar2 = lexString(pat->val);
      sVar3 = strlen(pcVar2);
      pcVar2 = lexString(pat->val);
      iVar1 = strncmp(pcVar2,a->atomname,(long)(int)sVar3);
      msg._96_4_ = ZEXT14(iVar1 == 0);
      break;
    case 0x13a:
      msg._96_4_ = ZEXT14(a->occ < (float)pat->val / 100.0);
      break;
    case 0x13b:
      msg._96_4_ = ZEXT14((float)pat->val / 100.0 < a->occ);
      break;
    case 0x13c:
      msg._96_4_ = ZEXT14(a->bval < (float)pat->val);
      break;
    case 0x13d:
      msg._96_4_ = ZEXT14((float)pat->val < a->bval);
      break;
    case 0x13e:
      msg._96_4_ = atomWithinDistance(a,pat->fvec);
      break;
    case 0x13f:
      pcVar2 = lexString(pat->val);
      sVar3 = strlen(pcVar2);
      pcVar2 = lexString(pat->val);
      iVar1 = strncmp(pcVar2,a->r->segid,(long)(int)sVar3);
      msg._96_4_ = ZEXT14(iVar1 == 0);
      break;
    case 0x140:
      msg._96_4_ = ZEXT14((int)a->r->resInsCode == pat->val);
      break;
    case 0x141:
      if (pat->lhs->val == 0x12d) {
        local_a0 = pat->lhs->lhs->val;
      }
      else {
        local_a0 = pat->lhs->val;
      }
      local_a1 = false;
      if (local_a0 <= a->r->resid) {
        if (pat->rhs->val == 0x12d) {
          local_ac = pat->rhs->lhs->val;
        }
        else {
          local_ac = pat->rhs->val;
        }
        local_a1 = a->r->resid <= local_ac;
      }
      msg._96_4_ = ZEXT14(local_a1);
      break;
    default:
      sprintf(local_88,"unknown pattern type: %d",(ulong)(uint)pat->type);
      halt(local_88);
    }
  }
  iVar1._0_1_ = msg[0x60];
  iVar1._1_1_ = msg[0x61];
  iVar1._2_1_ = msg[0x62];
  iVar1._3_1_ = msg[99];
  return iVar1;
}

Assistant:

int matchPat(atom *a, pattern *pat)
{
  int lp, rc = FALSE;

  if (pat)
  {
   switch(pat->type)
   {
   case     OR_NODE: rc = matchPat(a, pat->lhs) ?
			   TRUE : matchPat(a, pat->rhs); break;
   case    AND_NODE: rc = matchPat(a, pat->lhs) ?
			   matchPat(a, pat->rhs) : FALSE; break;
   case    NOT_NODE: rc = !matchPat(a, pat->lhs); break;
   case   FILE_NODE: rc = (a->r->file  == pat->val); break;
   case  MODEL_NODE: rc = (a->r->model == pat->val); break;
   case  CHAIN_NODE: lp = strlen(lexString(pat->val));
                     rc = (strncmp(lexString(pat->val), a->r->chain, lp)
                                                            == 0); break;
   case    ALT_NODE: rc = (a->altConf == ' ' || a->altConf == pat->val); break;
   case    RES_NODE: rc = (a->r->resid == pat->val); break;
   case  RANGE_NODE: rc = (pat->lhs->val <= a->r->resid
                             && a->r->resid <= pat->rhs->val); break;
   case  RTYPE_NODE: lp = strlen(lexString(pat->val));
		     rc = (strncmp(lexString(pat->val), a->r->resname, lp)
							    == 0); break;
   case   DIST_NODE: rc = atomWithinDistance(a, pat->fvec); break;
   case   PROP_NODE: rc = (a->props & pat->val); break;
   case  ANAME_NODE: lp = strlen(lexString(pat->val));
		     rc = (strncmp(lexString(pat->val), a->atomname, lp)
							    == 0); break;
   case  SEGID_NODE: lp = strlen(lexString(pat->val));
		     rc = (strncmp(lexString(pat->val), a->r->segid, lp)
							    == 0); break;
   case   TRUE_NODE: rc = TRUE;  break;
   case  FALSE_NODE: rc = FALSE; break;
   case OCC_LT_NODE: rc = (a->occ  < pat->val/100.0); break;
   case OCC_GT_NODE: rc = (a->occ  > pat->val/100.0); break;
   case   B_LT_NODE: rc = (a->bval < pat->val); break;
   case   B_GT_NODE: rc = (a->bval > pat->val); break;
   case    INS_NODE: rc = (a->r->resInsCode == pat->val); break;

 /* ignores the insertion code */
   case INS_RANGE_NODE: rc = (((pat->lhs->val == AND_NODE)
                                ? pat->lhs->lhs->val
				: pat->lhs->val)
				<= a->r->resid
                             && a->r->resid <=
			      ((pat->rhs->val == AND_NODE)
                                ? pat->rhs->lhs->val
				: pat->rhs->val));
			break;
   default: { char msg[100];
         sprintf(msg, "unknown pattern type: %d", pat->type);
         halt(msg);
      }
   }/*switch*/
  }
  return rc;
}